

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

PackageSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::PackageSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::NetType_const&,slang::ast::VariableLifetime>
          (BumpAllocator *this,Compilation *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1,SourceLocation *args_2,
          NetType *args_3,VariableLifetime *args_4)

{
  string_view name;
  PackageSymbol *this_00;
  
  this_00 = (PackageSymbol *)allocate(this,0xa8,8);
  name._M_len = args_1->_M_len;
  name._M_str = args_1->_M_str;
  ast::PackageSymbol::PackageSymbol(this_00,args,name,*args_2,args_3,*args_4);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }